

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::ReadHeader(Document *this)

{
  Scope *pSVar1;
  uint uVar2;
  Element *pEVar3;
  Token *pTVar4;
  Token *t;
  Scope *stimestamp;
  allocator<char> local_39;
  string local_38;
  
  pSVar1 = (this->parser->root)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
           super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FBXHeaderExtension",&local_39);
  pEVar3 = Scope::operator[](pSVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((pEVar3 != (Element *)0x0) &&
     (pSVar1 = (pEVar3->compound)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl,
     pSVar1 != (Scope *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"FBXVersion",&local_39);
    pEVar3 = GetRequiredElement(pSVar1,&local_38,pEVar3);
    pTVar4 = GetRequiredToken(pEVar3,0);
    uVar2 = ParseTokenAsInt(pTVar4);
    this->fbxVersion = uVar2;
    std::__cxx11::string::~string((string *)&local_38);
    if (this->fbxVersion < 0x1bbc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "unsupported, old format version, supported are only FBX 2011, FBX 2012 and FBX 2013"
                 ,&local_39);
      Util::DOMError(&local_38,(Element *)0x0);
    }
    if (0x1ce8 < this->fbxVersion) {
      if (this->settings->strictMode == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013 (turn off strict mode to try anyhow) "
                   ,&local_39);
        Util::DOMError(&local_38,(Element *)0x0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013, trying to read it nevertheless"
                 ,&local_39);
      Util::DOMWarning(&local_38,(Element *)0x0);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Creator",&local_39);
    pEVar3 = Scope::operator[](pSVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pEVar3 != (Element *)0x0) {
      pTVar4 = GetRequiredToken(pEVar3,0);
      ParseTokenAsString_abi_cxx11_(&local_38,(FBX *)pTVar4,t);
      std::__cxx11::string::operator=((string *)&this->creator,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CreationTimeStamp",&local_39);
    pEVar3 = Scope::operator[](pSVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if ((pEVar3 != (Element *)0x0) &&
       (pSVar1 = (pEVar3->compound)._M_t.
                 super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                 .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl,
       pSVar1 != (Scope *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Year",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[0] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Month",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[1] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Day",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[2] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hour",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[3] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Minute",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[4] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Second",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[5] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Millisecond",&local_39);
      pEVar3 = GetRequiredElement(pSVar1,&local_38,(Element *)0x0);
      pTVar4 = GetRequiredToken(pEVar3,0);
      uVar2 = ParseTokenAsInt(pTVar4);
      this->creationTimeStamp[6] = uVar2;
      std::__cxx11::string::~string((string *)&local_38);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"no FBXHeaderExtension dictionary found",&local_39);
  Util::DOMError(&local_38,(Element *)0x0);
}

Assistant:

void Document::ReadHeader() {
    // Read ID objects from "Objects" section
    const Scope& sc = parser.GetRootScope();
    const Element* const ehead = sc["FBXHeaderExtension"];
    if(!ehead || !ehead->Compound()) {
        DOMError("no FBXHeaderExtension dictionary found");
    }

    const Scope& shead = *ehead->Compound();
    fbxVersion = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(shead,"FBXVersion",ehead),0));

    // While we may have some success with newer files, we don't support
    // the older 6.n fbx format
    if(fbxVersion < LowerSupportedVersion ) {
        DOMError("unsupported, old format version, supported are only FBX 2011, FBX 2012 and FBX 2013");
    }
    if(fbxVersion > UpperSupportedVersion ) {
        if(Settings().strictMode) {
            DOMError("unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013"
                " (turn off strict mode to try anyhow) ");
        }
        else {
            DOMWarning("unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013,"
                " trying to read it nevertheless");
        }
    }

    const Element* const ecreator = shead["Creator"];
    if(ecreator) {
        creator = ParseTokenAsString(GetRequiredToken(*ecreator,0));
    }

    const Element* const etimestamp = shead["CreationTimeStamp"];
    if(etimestamp && etimestamp->Compound()) {
        const Scope& stimestamp = *etimestamp->Compound();
        creationTimeStamp[0] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Year"),0));
        creationTimeStamp[1] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Month"),0));
        creationTimeStamp[2] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Day"),0));
        creationTimeStamp[3] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Hour"),0));
        creationTimeStamp[4] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Minute"),0));
        creationTimeStamp[5] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Second"),0));
        creationTimeStamp[6] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Millisecond"),0));
    }
}